

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Bool setContext(XML_Parser parser,XML_Char *context)

{
  STRING_POOL *pool;
  char cVar1;
  DTD *table;
  char *pcVar2;
  bool bVar3;
  XML_Bool XVar4;
  XML_Error XVar5;
  NAMED *pNVar6;
  PREFIX *prefix;
  XML_Char *pXVar7;
  char *pcVar8;
  XML_Char *s;
  
  if (*context != '\0') {
    table = parser->m_dtd;
    pool = &parser->m_tempPool;
    pcVar8 = context;
    do {
      cVar1 = *context;
      if (cVar1 == '\0') {
LAB_00581e45:
        if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
           (XVar4 = poolGrow(pool), XVar4 == '\0')) {
          bVar3 = false;
        }
        else {
          pXVar7 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pXVar7 + 1;
          *pXVar7 = '\0';
          pNVar6 = lookup(parser,&table->generalEntities,(parser->m_tempPool).start,0);
          if (pNVar6 != (NAMED *)0x0) {
            *(undefined1 *)&pNVar6[7].name = 1;
          }
          context = context + (*context != '\0');
          (parser->m_tempPool).ptr = (parser->m_tempPool).start;
          bVar3 = true;
          pcVar8 = context;
        }
joined_r0x0058205d:
        if (!bVar3) {
          return '\0';
        }
      }
      else {
        if (cVar1 == '=') {
          pXVar7 = (parser->m_tempPool).ptr;
          pcVar2 = context;
          prefix = &table->defaultPrefix;
          if (pXVar7 == (parser->m_tempPool).start) {
LAB_00581f60:
            while( true ) {
              pcVar8 = pcVar2 + 1;
              if ((*pcVar8 == '\0') || (*pcVar8 == '\f')) break;
              if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
                 (XVar4 = poolGrow(pool), XVar4 == '\0')) goto LAB_00582057;
              cVar1 = *pcVar8;
              pcVar2 = (parser->m_tempPool).ptr;
              (parser->m_tempPool).ptr = pcVar2 + 1;
              *pcVar2 = cVar1;
              pcVar2 = pcVar8;
            }
            if (((parser->m_tempPool).ptr != (parser->m_tempPool).end) ||
               (XVar4 = poolGrow(pool), XVar4 != '\0')) {
              pXVar7 = (parser->m_tempPool).ptr;
              (parser->m_tempPool).ptr = pXVar7 + 1;
              *pXVar7 = '\0';
              bVar3 = false;
              XVar5 = addBinding(parser,prefix,(ATTRIBUTE_ID *)0x0,(parser->m_tempPool).start,
                                 &parser->m_inheritedBindings);
              if (XVar5 == XML_ERROR_NONE) {
                (parser->m_tempPool).ptr = (parser->m_tempPool).start;
                context = pcVar8;
                if (*pcVar8 != '\0') {
                  context = pcVar2 + 2;
                }
                bVar3 = true;
                pcVar8 = context;
              }
              goto joined_r0x0058205d;
            }
          }
          else if ((pXVar7 != (parser->m_tempPool).end) || (XVar4 = poolGrow(pool), XVar4 != '\0'))
          {
            pXVar7 = (parser->m_tempPool).ptr;
            (parser->m_tempPool).ptr = pXVar7 + 1;
            *pXVar7 = '\0';
            prefix = (PREFIX *)lookup(parser,&table->prefixes,(parser->m_tempPool).start,0x10);
            if (prefix != (PREFIX *)0x0) {
              if (prefix->name == (parser->m_tempPool).start) {
                pXVar7 = poolCopyString(&table->pool,prefix->name);
                prefix->name = pXVar7;
                if (pXVar7 == (XML_Char *)0x0) goto LAB_00582057;
              }
              (parser->m_tempPool).ptr = (parser->m_tempPool).start;
              goto LAB_00581f60;
            }
          }
LAB_00582057:
          bVar3 = false;
          goto joined_r0x0058205d;
        }
        if (cVar1 == '\f') goto LAB_00581e45;
        if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
           (XVar4 = poolGrow(pool), XVar4 == '\0')) {
          return '\0';
        }
        cVar1 = *context;
        pcVar2 = (parser->m_tempPool).ptr;
        (parser->m_tempPool).ptr = pcVar2 + 1;
        *pcVar2 = cVar1;
        context = context + 1;
      }
    } while (*pcVar8 != '\0');
  }
  return '\x01';
}

Assistant:

static XML_Bool
setContext(XML_Parser parser, const XML_Char *context) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  const XML_Char *s = context;

  while (*context != XML_T('\0')) {
    if (*s == CONTEXT_SEP || *s == XML_T('\0')) {
      ENTITY *e;
      if (! poolAppendChar(&parser->m_tempPool, XML_T('\0')))
        return XML_FALSE;
      e = (ENTITY *)lookup(parser, &dtd->generalEntities,
                           poolStart(&parser->m_tempPool), 0);
      if (e)
        e->open = XML_TRUE;
      if (*s != XML_T('\0'))
        s++;
      context = s;
      poolDiscard(&parser->m_tempPool);
    } else if (*s == XML_T(ASCII_EQUALS)) {
      PREFIX *prefix;
      if (poolLength(&parser->m_tempPool) == 0)
        prefix = &dtd->defaultPrefix;
      else {
        if (! poolAppendChar(&parser->m_tempPool, XML_T('\0')))
          return XML_FALSE;
        prefix
            = (PREFIX *)lookup(parser, &dtd->prefixes,
                               poolStart(&parser->m_tempPool), sizeof(PREFIX));
        if (! prefix)
          return XML_FALSE;
        if (prefix->name == poolStart(&parser->m_tempPool)) {
          prefix->name = poolCopyString(&dtd->pool, prefix->name);
          if (! prefix->name)
            return XML_FALSE;
        }
        poolDiscard(&parser->m_tempPool);
      }
      for (context = s + 1; *context != CONTEXT_SEP && *context != XML_T('\0');
           context++)
        if (! poolAppendChar(&parser->m_tempPool, *context))
          return XML_FALSE;
      if (! poolAppendChar(&parser->m_tempPool, XML_T('\0')))
        return XML_FALSE;
      if (addBinding(parser, prefix, NULL, poolStart(&parser->m_tempPool),
                     &parser->m_inheritedBindings)
          != XML_ERROR_NONE)
        return XML_FALSE;
      poolDiscard(&parser->m_tempPool);
      if (*context != XML_T('\0'))
        ++context;
      s = context;
    } else {
      if (! poolAppendChar(&parser->m_tempPool, *s))
        return XML_FALSE;
      s++;
    }
  }
  return XML_TRUE;
}